

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O0

Expression * __thiscall
wasm::PossibleConstantValues::makeExpression(PossibleConstantValues *this,Module *wasm)

{
  bool bVar1;
  Global *pGVar2;
  Name name_00;
  Name name;
  Literal local_40;
  Builder local_28;
  Builder builder;
  Module *wasm_local;
  PossibleConstantValues *this_local;
  
  builder.wasm = wasm;
  Builder::Builder(&local_28,wasm);
  bVar1 = isConstantLiteral(this);
  if (bVar1) {
    getConstantLiteral(&local_40,this);
    this_local = (PossibleConstantValues *)Builder::makeConstantExpression(&local_28,&local_40);
    wasm::Literal::~Literal(&local_40);
  }
  else {
    name_00 = getConstantGlobal(this);
    pGVar2 = Module::getGlobal(builder.wasm,name_00);
    this_local = (PossibleConstantValues *)
                 Builder::makeGlobalGet(&local_28,name_00,(Type)(pGVar2->type).id);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* makeExpression(Module& wasm) const {
    Builder builder(wasm);
    if (isConstantLiteral()) {
      return builder.makeConstantExpression(getConstantLiteral());
    } else {
      auto name = getConstantGlobal();
      return builder.makeGlobalGet(name, wasm.getGlobal(name)->type);
    }
  }